

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

void nghttp2_frame_altsvc_init
               (nghttp2_extension *frame,int32_t stream_id,uint8_t *origin,size_t origin_len,
               uint8_t *field_value,size_t field_value_len)

{
  undefined8 *puVar1;
  nghttp2_ext_altsvc *altsvc;
  size_t field_value_len_local;
  uint8_t *field_value_local;
  size_t origin_len_local;
  uint8_t *origin_local;
  int32_t stream_id_local;
  nghttp2_extension *frame_local;
  
  nghttp2_frame_hd_init(&frame->hd,origin_len + 2 + field_value_len,'\n','\0',stream_id);
  puVar1 = (undefined8 *)frame->payload;
  *puVar1 = origin;
  puVar1[1] = origin_len;
  puVar1[2] = field_value;
  puVar1[3] = field_value_len;
  return;
}

Assistant:

void nghttp2_frame_altsvc_init(nghttp2_extension *frame, int32_t stream_id,
                               uint8_t *origin, size_t origin_len,
                               uint8_t *field_value, size_t field_value_len) {
  nghttp2_ext_altsvc *altsvc;

  nghttp2_frame_hd_init(&frame->hd, 2 + origin_len + field_value_len,
                        NGHTTP2_ALTSVC, NGHTTP2_FLAG_NONE, stream_id);

  altsvc = frame->payload;
  altsvc->origin = origin;
  altsvc->origin_len = origin_len;
  altsvc->field_value = field_value;
  altsvc->field_value_len = field_value_len;
}